

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

cio_error send_frame(cio_websocket *websocket,cio_websocket_write_job *job,size_t frame_length)

{
  uint16_t uVar1;
  size_t sVar2;
  cio_http_client *client;
  size_t job_length_1;
  cio_http_client *client_1;
  size_t job_length;
  uint64_t uStack_48;
  uint8_t mask [4];
  uint64_t be_len_1;
  uint16_t be_len;
  size_t sStack_38;
  uint8_t first_byte;
  size_t header_index;
  uint8_t first_len;
  size_t frame_length_local;
  cio_websocket_write_job *job_local;
  cio_websocket *websocket_local;
  
  if ((job->is_continuation_chunk & 1U) == 0) {
    sStack_38 = 2;
    be_len_1._7_1_ = (byte)job->frame_type;
    if ((job->last_frame & 1U) != 0) {
      be_len_1._7_1_ = be_len_1._7_1_ | 0x80;
    }
    job->send_header[0] = be_len_1._7_1_;
    if (frame_length < 0x7e) {
      header_index._7_1_ = (byte)frame_length;
    }
    else if (frame_length < 0x10000) {
      uVar1 = cio_htobe16((uint16_t)frame_length);
      *(uint16_t *)(job->send_header + 2) = uVar1;
      sStack_38 = 4;
      header_index._7_1_ = 0x7e;
    }
    else {
      uStack_48 = cio_htobe64(frame_length);
      *(uint64_t *)(job->send_header + 2) = uStack_48;
      sStack_38 = 10;
      header_index._7_1_ = 0x7f;
    }
    if ((*(ushort *)&(websocket->ws_private).ws_flags >> 10 & 1) == 0) {
      header_index._7_1_ = header_index._7_1_ | 0x80;
      cio_random_get_bytes(&(websocket->ws_private).rng,(void *)((long)&job_length + 4),4);
      *(undefined4 *)(job->send_header + sStack_38) = job_length._4_4_;
      sStack_38 = sStack_38 + 4;
      mask_write_buffer(job->wbh,(uint8_t *)((long)&job_length + 4),4);
      sVar2 = cio_write_buffer_get_total_size(job->wbh);
      if (sVar2 < frame_length) {
        *(undefined4 *)(websocket->ws_private).chunk_send_mask = job_length._4_4_;
      }
    }
    job->send_header[1] = header_index._7_1_;
    cio_write_buffer_element_init(&job->websocket_header,job->send_header,sStack_38);
    add_websocket_header(job);
    websocket_local._4_4_ =
         cio_buffered_stream_write
                   (&((websocket->ws_private).http_client)->buffered_stream,job->wbh,
                    job->stream_handler,websocket);
  }
  else {
    if ((*(ushort *)&(websocket->ws_private).ws_flags >> 10 & 1) == 0) {
      mask_write_buffer(job->wbh,(websocket->ws_private).chunk_send_mask,4);
      sVar2 = cio_write_buffer_get_total_size(job->wbh);
      cio_websocket_correct_mask((websocket->ws_private).chunk_send_mask,sVar2);
    }
    websocket_local._4_4_ =
         cio_buffered_stream_write
                   (&((websocket->ws_private).http_client)->buffered_stream,job->wbh,
                    job->stream_handler,websocket);
  }
  return websocket_local._4_4_;
}

Assistant:

static enum cio_error send_frame(struct cio_websocket *websocket, struct cio_websocket_write_job *job, size_t frame_length)
{
	if (!job->is_continuation_chunk) {
		uint8_t first_len = 0;
		size_t header_index = 2;

		uint8_t first_byte = (uint8_t)job->frame_type;
		if (job->last_frame) {
			first_byte |= WS_HEADER_FIN;
		}

		job->send_header[0] = first_byte;

		if (frame_length <= CIO_WEBSOCKET_SMALL_FRAME_SIZE) {
			first_len = (uint8_t)frame_length;
		} else if (frame_length <= WS_MID_FRAME_SIZE) {
			uint16_t be_len = cio_htobe16((uint16_t)frame_length);
			memcpy(&job->send_header[2], &be_len, sizeof(be_len));
			header_index += sizeof(be_len);
			first_len = CIO_WEBSOCKET_SMALL_FRAME_SIZE + 1;
		} else {
			uint64_t be_len = cio_htobe64((uint64_t)frame_length);
			memcpy(&job->send_header[2], &be_len, sizeof(be_len));
			header_index += sizeof(be_len);
			first_len = CIO_WEBSOCKET_SMALL_FRAME_SIZE + 2;
		}

		if (websocket->ws_private.ws_flags.is_server == 0U) {
			first_len |= WS_MASK_SET;
			uint8_t mask[4];
			cio_random_get_bytes(&websocket->ws_private.rng, mask, sizeof(mask));
			memcpy(&job->send_header[header_index], &mask, sizeof(mask));

			header_index += sizeof(mask);
			mask_write_buffer(job->wbh, mask, sizeof(mask));

			size_t job_length = cio_write_buffer_get_total_size(job->wbh);
			if (job_length < frame_length) {
				memcpy(websocket->ws_private.chunk_send_mask, mask, sizeof(mask));
			}
		}

		job->send_header[1] = first_len;

		cio_write_buffer_element_init(&job->websocket_header, job->send_header, header_index);
		add_websocket_header(job);
		struct cio_http_client *client = websocket->ws_private.http_client;
		return cio_buffered_stream_write(&client->buffered_stream, job->wbh, job->stream_handler, websocket);
	}

	if (websocket->ws_private.ws_flags.is_server == 0U) {
		mask_write_buffer(job->wbh, websocket->ws_private.chunk_send_mask, sizeof(websocket->ws_private.chunk_send_mask));
		size_t job_length = cio_write_buffer_get_total_size(job->wbh);
		cio_websocket_correct_mask(websocket->ws_private.chunk_send_mask, job_length);
	}

	struct cio_http_client *client = websocket->ws_private.http_client;
	return cio_buffered_stream_write(&client->buffered_stream, job->wbh, job->stream_handler, websocket);
}